

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecProtocol.cpp
# Opt level: O0

char * HdmiCec::GetDevAddressString(DevAddress devAddress)

{
  char *pcStack_10;
  DevAddress devAddress_local;
  
  switch(devAddress) {
  case DevAddress_TV:
    pcStack_10 = "TV";
    break;
  case DevAddress_Recorder1:
    pcStack_10 = "Recorder1";
    break;
  case DevAddress_Recorder2:
    pcStack_10 = "Recorder2";
    break;
  case DevAddress_Tuner1:
    pcStack_10 = "Tuner1";
    break;
  case DevAddress_Player1:
    pcStack_10 = "Player1";
    break;
  case DevAddress_AudioSystem:
    pcStack_10 = "AudioSystem";
    break;
  case DevAddress_Tuner2:
    pcStack_10 = "Tuner2";
    break;
  case DevAddress_Tuner3:
    pcStack_10 = "Tuner3";
    break;
  case DevAddress_Player2:
    pcStack_10 = "Player2";
    break;
  case DevAddress_Recorder3:
    pcStack_10 = "Recorder3";
    break;
  case DevAddress_Tuner4:
    pcStack_10 = "Tuner4";
    break;
  case DevAddress_Player3:
    pcStack_10 = "Player3";
    break;
  case DevAddress_Reserved1:
    pcStack_10 = "Reserved1";
    break;
  case DevAddress_Reserved2:
    pcStack_10 = "Reserved2";
    break;
  case DevAddress_FreeUse:
    pcStack_10 = "FreeUse";
    break;
  case DevAddress_UnregBcast:
    pcStack_10 = "Unreg/Bcast";
    break;
  default:
    pcStack_10 = "Invalid";
  }
  return pcStack_10;
}

Assistant:

const char* GetDevAddressString( DevAddress devAddress )
    {
        switch( devAddress )
        {
        case DevAddress_TV:
            return "TV";
        case DevAddress_Recorder1:
            return "Recorder1";
        case DevAddress_Recorder2:
            return "Recorder2";
        case DevAddress_Tuner1:
            return "Tuner1";
        case DevAddress_Player1:
            return "Player1";
        case DevAddress_AudioSystem:
            return "AudioSystem";
        case DevAddress_Tuner2:
            return "Tuner2";
        case DevAddress_Tuner3:
            return "Tuner3";
        case DevAddress_Player2:
            return "Player2";
        case DevAddress_Recorder3:
            return "Recorder3";
        case DevAddress_Tuner4:
            return "Tuner4";
        case DevAddress_Player3:
            return "Player3";
        case DevAddress_Reserved1:
            return "Reserved1";
        case DevAddress_Reserved2:
            return "Reserved2";
        case DevAddress_FreeUse:
            return "FreeUse";
        case DevAddress_UnregBcast:
            return "Unreg/Bcast";
        default:
            break;
        }
        return "Invalid";
    }